

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# owning_string_map.hpp
# Opt level: O1

pair<std::__detail::_Node_iterator<std::pair<const_duckdb::string_t,_unsigned_long>,_false,_true>,_bool>
 __thiscall
duckdb::
OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
::insert(OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
         *this,value_type entry)

{
  undefined4 uVar1;
  data_ptr_t __dest;
  ulong size;
  undefined8 __src;
  pair<std::__detail::_Node_iterator<std::pair<const_duckdb::string_t,_unsigned_long>,_false,_true>,_bool>
  pVar2;
  undefined4 local_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  _Hashtable<duckdb::string_t,std::pair<duckdb::string_t_const,unsigned_long>,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>,std::__detail::_Select1st,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_50;
  undefined8 local_48;
  char *local_40;
  unsigned_long local_38;
  
  uVar1 = entry.first.value.pointer.length;
  __src = entry.first.value.pointer.ptr;
  local_50 = (_Hashtable<duckdb::string_t,std::pair<duckdb::string_t_const,unsigned_long>,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>,std::__detail::_Select1st,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->map;
  if ((uint)entry.first.value._0_4_ < 0xd) {
    pVar2 = ::std::
            _Hashtable<duckdb::string_t,std::pair<duckdb::string_t_const,unsigned_long>,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>,std::__detail::_Select1st,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::pair<duckdb::string_t_const,unsigned_long>>(local_50,&entry);
  }
  else {
    local_48 = entry.first.value._0_8_;
    local_40 = entry.first.value.pointer.ptr;
    size = local_48 & 0xffffffff;
    __dest = Allocator::AllocateData(this->allocator,size);
    if (size < 0xd) {
      __src = (char *)((long)&local_48 + 4);
    }
    switchD_012dd528::default(__dest,(void *)__src,size);
    if (size < 0xd) {
      local_58 = 0;
      local_60 = 0;
      uStack_5c = 0;
      if (uVar1 != 0) {
        switchD_012dd528::default(&local_60,(void *)__src,size);
      }
    }
    else {
      local_60 = *(undefined4 *)__dest;
      uStack_5c = SUB84(__dest,0);
      local_58 = (undefined4)((ulong)__dest >> 0x20);
    }
    local_40 = (char *)CONCAT44(local_58,uStack_5c);
    local_48 = CONCAT44(local_60,uVar1);
    local_38 = entry.second;
    pVar2 = ::std::
            _Hashtable<duckdb::string_t,std::pair<duckdb::string_t_const,unsigned_long>,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>,std::__detail::_Select1st,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::pair<duckdb::string_t,unsigned_long>>(local_50);
  }
  return pVar2;
}

Assistant:

pair<iterator, bool> insert(value_type entry) { // NOLINT: match std style
		if (entry.first.IsInlined()) {
			return map.insert(std::move(entry));
		} else {
			return map.insert(make_pair(CopyString(entry.first), std::move(entry.second)));
		}
	}